

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::prefix_expression::~prefix_expression(prefix_expression *this)

{
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__prefix_expression_001ca280;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->e_);
  syntax_node::~syntax_node((syntax_node *)this);
  return;
}

Assistant:

explicit prefix_expression(const source_extend& extend, token_type op, expression_ptr&& e) : expression(extend), op_(op), e_(std::move(e)) {
        assert(e_);
    }